

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingcall.cpp
# Opt level: O0

QDBusMessage __thiscall QDBusPendingCall::reply(QDBusPendingCall *this)

{
  long lVar1;
  bool bVar2;
  QDBusError *in_RSI;
  QDBusMessagePrivate *in_RDI;
  long in_FS_OFFSET;
  scoped_lock<QMutex> locker;
  QDBusMessagePrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22cc5b);
  if (bVar2) {
    error((QDBusPendingCall *)in_RSI);
    QDBusMessage::createError(in_RSI);
    QDBusError::~QDBusError((QDBusError *)this_00);
  }
  else {
    QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
              ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22cca0);
    (anonymous_namespace)::qt_scoped_lock<QMutex,std::scoped_lock<QMutex>>((QMutex *)in_RDI);
    QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
              ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22ccbb);
    QDBusMessage::QDBusMessage((QDBusMessage *)this_00,(QDBusMessage *)in_RDI);
    std::scoped_lock<QMutex>::~scoped_lock((scoped_lock<QMutex> *)0x22ccd5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDBusMessage)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDBusMessage QDBusPendingCall::reply() const
{
    if (!d)
        return QDBusMessage::createError(error());
    const auto locker = qt_scoped_lock(d->mutex);
    return d->replyMessage;
}